

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O3

FT_Error cid_load_glyph(T1_Decoder_conflict decoder,FT_UInt glyph_index)

{
  FT_CharMap *ppFVar1;
  uint uVar2;
  FT_Face pFVar3;
  FT_Stream stream;
  FT_Incremental_InterfaceRec *pFVar4;
  FT_CharMap *ppFVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  FT_CharMap pFVar9;
  FT_CharMap pFVar10;
  FT_Long FVar11;
  uchar *puVar12;
  FT_Byte *buffer;
  FT_Fixed FVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  FT_Memory memory;
  ulong uVar19;
  undefined1 uVar20;
  FT_Error error;
  FT_Data glyph_data;
  CFF_SubFontRec subfont;
  FT_Error local_a24;
  FT_Memory local_a20;
  T1_Decoder_conflict local_a18;
  FT_Incremental_InterfaceRec *local_a10;
  FT_UInt local_a04;
  FT_Byte *local_a00;
  FT_Long local_9f8;
  long local_9f0;
  FT_Incremental_MetricsRec local_9e8 [33];
  undefined1 *local_5c8;
  undefined1 local_4f8 [1224];
  
  pFVar3 = (decoder->builder).face;
  stream = (FT_Stream)pFVar3[2].bbox.yMax;
  local_a24 = 0;
  memory = pFVar3->memory;
  local_9f8 = pFVar3[1].face_index;
  pFVar4 = pFVar3->internal->incremental_interface;
  if (pFVar4 == (FT_Incremental_InterfaceRec *)0x0) {
    iVar17 = *(int *)&pFVar3[2].field_0x3c + pFVar3[2].num_fixed_sizes;
    local_a10 = pFVar4;
    local_a24 = FT_Stream_Seek(stream,(FT_ULong)
                                      (pFVar3[2].style_name +
                                      (ulong)(iVar17 * glyph_index) + (long)pFVar3[2].generic.data))
    ;
    if ((local_a24 != 0) ||
       (local_a04 = glyph_index, local_a24 = FT_Stream_EnterFrame(stream,(ulong)(uint)(iVar17 * 2)),
       local_a24 != 0)) {
      uVar20 = 0;
      buffer = (FT_Byte *)0x0;
      goto LAB_00226b9b;
    }
    puVar12 = stream->cursor;
    uVar14 = (ulong)(uint)pFVar3[2].num_fixed_sizes;
    if (uVar14 == 0) {
      uVar18 = 0;
    }
    else {
      lVar15 = 0;
      uVar18 = 0;
      do {
        uVar18 = (ulong)puVar12[lVar15] | uVar18 << 8;
        lVar15 = lVar15 + 1;
      } while (pFVar3[2].num_fixed_sizes != (uint)lVar15);
      puVar12 = puVar12 + uVar14;
    }
    uVar2 = *(uint *)&pFVar3[2].field_0x3c;
    if ((ulong)uVar2 == 0) {
      uVar16 = 0;
      uVar19 = 0;
    }
    else {
      lVar15 = 0;
      uVar16 = 0;
      do {
        uVar16 = (ulong)puVar12[lVar15] | uVar16 << 8;
        lVar15 = lVar15 + 1;
      } while (uVar2 != (uint)lVar15);
      lVar15 = 0;
      uVar19 = 0;
      do {
        uVar19 = (ulong)puVar12[lVar15 + uVar14 + uVar2] | uVar19 << 8;
        lVar15 = lVar15 + 1;
      } while (uVar2 != (uint)lVar15);
    }
    local_a20 = memory;
    local_a18 = decoder;
    FT_Stream_ExitFrame(stream);
    if (((uVar18 < (uint)pFVar3[2].num_charmaps) && (uVar19 <= stream->size)) && (uVar16 <= uVar19))
    {
      uVar19 = uVar19 - uVar16;
      if (uVar19 != 0) {
        buffer = (FT_Byte *)ft_mem_qalloc(local_a20,uVar19,&local_a24);
        if ((local_a24 == 0) &&
           (local_a24 = FT_Stream_ReadAt(stream,uVar16 + (long)pFVar3[2].generic.data,buffer,uVar19)
           , local_a24 == 0)) {
          local_a24 = 0;
          decoder = local_a18;
          goto LAB_00226ca1;
        }
        goto LAB_00226d4a;
      }
    }
    else {
      local_a24 = 9;
    }
    buffer = (FT_Byte *)0x0;
LAB_00226d4a:
    uVar20 = 0;
    decoder = local_a18;
    memory = local_a20;
  }
  else {
    local_a24 = (*pFVar4->funcs->get_glyph_data)(pFVar4->object,glyph_index,(FT_Data *)local_9e8);
    if (local_a24 == 0) {
      uVar2 = pFVar3[2].num_fixed_sizes;
      if ((uint)local_9e8[0].bearing_y < uVar2) {
        buffer = (FT_Byte *)0x0;
        local_a20 = memory;
        local_a04 = glyph_index;
      }
      else {
        if (uVar2 == 0) {
          uVar18 = 0;
        }
        else {
          lVar15 = 0;
          uVar18 = 0;
          do {
            uVar18 = uVar18 << 8 | (ulong)*(byte *)(local_9e8[0].bearing_x + lVar15);
            lVar15 = lVar15 + 1;
          } while (uVar2 != (uint)lVar15);
        }
        uVar19 = (ulong)((uint)local_9e8[0].bearing_y - uVar2);
        local_a20 = memory;
        local_a10 = pFVar4;
        local_a04 = glyph_index;
        buffer = (FT_Byte *)ft_mem_qalloc(memory,uVar19,&local_a24);
        if (local_a24 == 0) {
          memcpy(buffer,(void *)(local_9e8[0].bearing_x + (ulong)(uint)pFVar3[2].num_fixed_sizes),
                 uVar19);
        }
        (*local_a10->funcs->free_glyph_data)(local_a10->object,(FT_Data *)local_9e8);
        memory = local_a20;
        if (local_a24 == 0) {
LAB_00226ca1:
          lVar15 = pFVar3[2].bbox.xMin;
          decoder->num_subrs = *(FT_Int *)(lVar15 + uVar18 * 0x10);
          decoder->subrs = *(FT_Byte ***)(lVar15 + 8 + uVar18 * 0x10);
          decoder->subrs_len = (FT_UInt *)0x0;
          decoder->subrs_hash = (FT_Hash)0x0;
          ppFVar5 = pFVar3[2].charmaps;
          pFVar9 = ppFVar5[uVar18 * 0x2a + 0x21];
          pFVar10 = (ppFVar5 + uVar18 * 0x2a + 0x21)[1];
          ppFVar1 = ppFVar5 + uVar18 * 0x2a + 0x23;
          uVar6 = *(undefined4 *)((long)ppFVar1 + 4);
          uVar7 = *(undefined4 *)(ppFVar1 + 1);
          uVar8 = *(undefined4 *)((long)ppFVar1 + 0xc);
          *(undefined4 *)&(decoder->font_matrix).yx = *(undefined4 *)ppFVar1;
          *(undefined4 *)((long)&(decoder->font_matrix).yx + 4) = uVar6;
          *(undefined4 *)&(decoder->font_matrix).yy = uVar7;
          *(undefined4 *)((long)&(decoder->font_matrix).yy + 4) = uVar8;
          (decoder->font_matrix).xx = (FT_Fixed)pFVar9;
          (decoder->font_matrix).xy = (FT_Fixed)pFVar10;
          pFVar9 = (ppFVar5 + uVar18 * 0x2a + 0x25)[1];
          (decoder->font_offset).x = (FT_Pos)ppFVar5[uVar18 * 0x2a + 0x25];
          (decoder->font_offset).y = (FT_Pos)pFVar9;
          uVar2 = *(uint *)((long)ppFVar5 + uVar18 * 0x150 + 4);
          decoder->lenIV = uVar2;
          uVar14 = 0;
          if (-1 < (int)uVar2) {
            uVar14 = (ulong)uVar2;
          }
          local_a18 = decoder;
          if (uVar14 <= uVar19) {
            local_9f0 = uVar19 - uVar14;
            if (-1 < (int)uVar2) {
              (**(code **)(local_9f8 + 0x20))(buffer,uVar19,0x10ea);
            }
            FVar11 = local_9f8;
            decoder = local_a18;
            local_a00 = buffer;
            if ((local_a18->builder).metrics_only == '\0') {
              (**(code **)(local_9f8 + 0x30))(local_9e8,local_a18,1);
              (**(code **)(FVar11 + 0x38))(pFVar3,ppFVar5 + uVar18 * 0x2a,local_4f8);
              lVar15 = local_9f0;
              local_5c8 = local_4f8;
              local_a24 = (**(code **)(*(long *)(FVar11 + 0x18) + 0x18))
                                    (local_9e8,buffer + uVar14,local_9f0);
              decoder = local_a18;
              if ((char)local_a24 == -0x5c) {
                *(undefined1 *)&(local_a18->builder).glyph[1].library = 0;
                local_a24 = (**(code **)(*(long *)(FVar11 + 0x18) + 0x18))
                                      (local_9e8,buffer + uVar14,lVar15);
                uVar20 = 1;
              }
              else {
                uVar20 = 0;
              }
            }
            else {
              local_a24 = (**(code **)(*(long *)(local_9f8 + 0x18) + 0x10))
                                    (local_a18,buffer + uVar14,(int)uVar19 - (int)uVar14);
              uVar20 = 0;
            }
            pFVar4 = local_a10;
            memory = local_a20;
            buffer = local_a00;
            if (((local_a10 != (FT_Incremental_InterfaceRec *)0x0) && (local_a24 == 0)) &&
               (local_a10->funcs->get_glyph_metrics != (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
              FVar13 = FT_RoundFix((decoder->builder).left_bearing.x);
              local_9e8[0].bearing_x = FVar13 >> 0x10;
              local_9e8[0].bearing_y = 0;
              FVar13 = FT_RoundFix((decoder->builder).advance.x);
              local_9e8[0].advance = FVar13 >> 0x10;
              FVar13 = FT_RoundFix((decoder->builder).advance.y);
              local_9e8[0].advance_v = FVar13 >> 0x10;
              local_a24 = (*pFVar4->funcs->get_glyph_metrics)
                                    (pFVar4->object,local_a04,'\0',local_9e8);
              (decoder->builder).left_bearing.x = local_9e8[0].bearing_x << 0x10;
              (decoder->builder).advance.x = local_9e8[0].advance << 0x10;
              (decoder->builder).advance.y = local_9e8[0].advance_v << 0x10;
              buffer = local_a00;
            }
            goto LAB_00226b9b;
          }
          local_a24 = 9;
          goto LAB_00226d4a;
        }
      }
    }
    else {
      buffer = (FT_Byte *)0x0;
    }
    uVar20 = 0;
  }
LAB_00226b9b:
  ft_mem_free(memory,buffer);
  *(undefined1 *)((long)&(decoder->builder).glyph[1].library + 1) = uVar20;
  return local_a24;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cid_load_glyph( T1_Decoder  decoder,
                  FT_UInt     glyph_index )
  {
    CID_Face       face = (CID_Face)decoder->builder.face;
    CID_FaceInfo   cid  = &face->cid;
    FT_Byte*       p;
    FT_ULong       fd_select;
    FT_Stream      stream       = face->cid_stream;
    FT_Error       error        = FT_Err_Ok;
    FT_Byte*       charstring   = NULL;
    FT_Memory      memory       = face->root.memory;
    FT_ULong       glyph_length = 0;
    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Bool  force_scaling = FALSE;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
                                   face->root.internal->incremental_interface;
#endif


    FT_TRACE1(( "cid_load_glyph: glyph index %u\n", glyph_index ));

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* For incremental fonts get the character data using */
    /* the callback function.                             */
    if ( inc )
    {
      FT_Data  glyph_data;


      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
      if ( error || glyph_data.length < cid->fd_bytes )
        goto Exit;

      p         = (FT_Byte*)glyph_data.pointer;
      fd_select = cid_get_offset( &p, cid->fd_bytes );

      glyph_length = glyph_data.length - cid->fd_bytes;

      if ( !FT_QALLOC( charstring, glyph_length ) )
        FT_MEM_COPY( charstring, glyph_data.pointer + cid->fd_bytes,
                     glyph_length );

      inc->funcs->free_glyph_data( inc->object, &glyph_data );

      if ( error )
        goto Exit;
    }

    else

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    /* For ordinary fonts read the CID font dictionary index */
    /* and charstring offset from the CIDMap.                */
    {
      FT_UInt   entry_len = cid->fd_bytes + cid->gd_bytes;
      FT_ULong  off1, off2;


      if ( FT_STREAM_SEEK( cid->data_offset + cid->cidmap_offset +
                           glyph_index * entry_len )               ||
           FT_FRAME_ENTER( 2 * entry_len )                         )
        goto Exit;

      p         = (FT_Byte*)stream->cursor;
      fd_select = cid_get_offset( &p, cid->fd_bytes );
      off1      = cid_get_offset( &p, cid->gd_bytes );
      p        += cid->fd_bytes;
      off2      = cid_get_offset( &p, cid->gd_bytes );
      FT_FRAME_EXIT();

      if ( fd_select >= cid->num_dicts ||
           off2 > stream->size         ||
           off1 > off2                 )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      glyph_length = off2 - off1;

      if ( glyph_length == 0                             ||
           FT_QALLOC( charstring, glyph_length )         ||
           FT_STREAM_READ_AT( cid->data_offset + off1,
                              charstring, glyph_length ) )
        goto Exit;
    }

    /* Now set up the subrs array and parse the charstrings. */
    {
      CID_FaceDict  dict;
      CID_Subrs     cid_subrs = face->subrs + fd_select;
      FT_UInt       cs_offset;


      /* Set up subrs */
      decoder->num_subrs  = cid_subrs->num_subrs;
      decoder->subrs      = cid_subrs->code;
      decoder->subrs_len  = 0;
      decoder->subrs_hash = NULL;

      /* Set up font matrix */
      dict                 = cid->font_dicts + fd_select;

      decoder->font_matrix = dict->font_matrix;
      decoder->font_offset = dict->font_offset;
      decoder->lenIV       = dict->private_dict.lenIV;

      /* Decode the charstring. */

      /* Adjustment for seed bytes. */
      cs_offset = decoder->lenIV >= 0 ? (FT_UInt)decoder->lenIV : 0;
      if ( cs_offset > glyph_length )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      /* Decrypt only if lenIV >= 0. */
      if ( decoder->lenIV >= 0 )
        psaux->t1_decrypt( charstring, glyph_length, 4330 );

      /* choose which renderer to use */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
      if ( ( (PS_Driver)FT_FACE_DRIVER( face ) )->hinting_engine ==
               FT_HINTING_FREETYPE                                  ||
           decoder->builder.metrics_only                            )
        error = psaux->t1_decoder_funcs->parse_charstrings_old(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#else
      if ( decoder->builder.metrics_only )
        error = psaux->t1_decoder_funcs->parse_metrics(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#endif
      else
      {
        PS_Decoder      psdecoder;
        CFF_SubFontRec  subfont;


        psaux->ps_decoder_init( &psdecoder, decoder, TRUE );

        psaux->t1_make_subfont( FT_FACE( face ),
                                &dict->private_dict,
                                &subfont );
        psdecoder.current_subfont = &subfont;

        error = psaux->t1_decoder_funcs->parse_charstrings(
                  &psdecoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          ((CID_GlyphSlot)decoder->builder.glyph)->hint = FALSE;

          force_scaling = TRUE;

          error = psaux->t1_decoder_funcs->parse_charstrings(
                    &psdecoder,
                    charstring + cs_offset,
                    glyph_length - cs_offset );
        }
      }
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error && inc && inc->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = FIXED_TO_INT( decoder->builder.left_bearing.x );
      metrics.bearing_y = 0;
      metrics.advance   = FIXED_TO_INT( decoder->builder.advance.x );
      metrics.advance_v = FIXED_TO_INT( decoder->builder.advance.y );

      error = inc->funcs->get_glyph_metrics( inc->object,
                                             glyph_index, FALSE, &metrics );

      decoder->builder.left_bearing.x = INT_TO_FIXED( metrics.bearing_x );
      decoder->builder.advance.x      = INT_TO_FIXED( metrics.advance );
      decoder->builder.advance.y      = INT_TO_FIXED( metrics.advance_v );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

  Exit:
    FT_FREE( charstring );

    ((CID_GlyphSlot)decoder->builder.glyph)->scaled = force_scaling;

    return error;
  }